

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  bool bVar1;
  ostream *poVar2;
  function<bool_(double)> *func_00;
  undefined1 local_100 [8];
  vector<double,_std::allocator<double>_> filtered;
  double local_e0 [2];
  iterator local_d0;
  size_type local_c8;
  undefined1 local_c0 [8];
  vector<double,_std::allocator<double>_> expectedFilter;
  undefined1 local_a0 [8];
  function<bool_(double)> func;
  allocator<double> local_69;
  double local_68 [6];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<double,_std::allocator<double>_> test;
  
  test.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  local_68[4] = 3.0;
  local_68[2] = 2.0;
  local_68[3] = 2.3;
  local_68[0] = 1.0;
  local_68[1] = 1.2;
  local_38 = local_68;
  local_30 = 5;
  std::allocator<double>::allocator(&local_69);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_28,__l_00,&local_69);
  std::allocator<double>::~allocator(&local_69);
  std::function<bool(double)>::function<main::__0,void>
            ((function<bool(double)> *)local_a0,
             (anon_class_1_0_00000001 *)
             ((long)&expectedFilter.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_e0[0] = 1.0;
  local_e0[1] = 1.2;
  local_d0 = local_e0;
  local_c8 = 2;
  func_00 = (function<bool_(double)> *)
            ((long)&filtered.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator((allocator<double> *)func_00);
  __l._M_len = local_c8;
  __l._M_array = local_d0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_c0,__l,(allocator_type *)func_00);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&filtered.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  poVar2 = std::operator<<((ostream *)&std::cout,"Test filter...");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Functional::filter<std::vector<double,std::allocator<double>>>
            ((vector<double,_std::allocator<double>_> *)local_100,(Functional *)local_28,
             (vector<double,_std::allocator<double>_> *)local_a0,func_00);
  bVar1 = std::operator==((vector<double,_std::allocator<double>_> *)local_c0,
                          (vector<double,_std::allocator<double>_> *)local_100);
  if (!bVar1) {
    __assert_fail("expectedFilter==filtered",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/filter/main.cpp"
                  ,0x11,"int main()");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"passed!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  test.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_100);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_c0);
  std::function<bool_(double)>::~function((function<bool_(double)> *)local_a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_28);
  return test.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int main(){

  vector<double> test={1.0, 1.2, 2.0, 2.3, 3.0};
  function< bool(double) > func= [] (const double & element){return element<2.0;};
  vector<double> expectedFilter={ 1.0, 1.2};
  cout << "Test filter..." << endl;
  auto filtered = Functional::filter(test,func); 
  assert( expectedFilter==filtered);
  cout << "passed!" << endl;
  
  return 0;

}